

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

bool jsonip::parse<jsonip::value>(value *t,istream *is)

{
  bool bVar1;
  undefined1 local_78 [8];
  state st;
  semantic_state ss;
  IStreamReader reader;
  
  st.ss_ = (semantic_state *)detail::calculate_helper<jsonip::value>::instance();
  local_78 = (undefined1  [8])t;
  semantic_state::semantic_state((semantic_state *)&st.line_,(state_t *)local_78);
  ss.state.
  super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)is;
  parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::ReaderState
            ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_78,
             (semantic_state *)&st.line_,
             (IStreamReader *)
             &ss.state.
              super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = parser::
          or_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::grammar::spaces_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::identity<true>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    ((ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *)local_78)
  ;
  std::
  _Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ::~_Vector_base((_Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
                   *)&st.reader_);
  std::
  _Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
  ::~_Vector_base((_Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
                   *)&st.line_);
  return bVar1;
}

Assistant:

bool parse(T& t, std::istream& is)
    {
        typedef parser::ReaderState<semantic_state, parser::IStreamReader> state;
        semantic_state ss(std::make_pair(holder(&t), detail::get_helper(t)));
        parser::IStreamReader reader(is);
        state st(ss, reader);

        return jsonip::grammar::gram::match(st);
    }